

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_tif_info(uint32_t width,uint32_t height,uint16_t bps,uint16_t spp,uint16_t config,
                   uint16_t type)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  undefined2 in_register_0000008a;
  ostream *poVar4;
  
  poVar4 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Resolution: ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"px x ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"px",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Type: ",8);
  switch(CONCAT22(in_register_0000008a,type)) {
  case 1:
    pcVar3 = "uint";
    goto LAB_00105655;
  case 2:
    pcVar3 = "int";
    lVar2 = 3;
    break;
  case 3:
    pcVar3 = "float";
    lVar2 = 5;
    break;
  case 4:
    pcVar3 = "void";
LAB_00105655:
    lVar2 = 4;
    break;
  case 5:
    pcVar3 = "complex int";
    lVar2 = 0xb;
    break;
  case 6:
    pcVar3 = "complex float";
    lVar2 = 0xd;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"unrecognized",0xc);
    goto LAB_0010569a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
LAB_0010569a:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Planar config:",0x10);
  if (config == 2) {
    pcVar3 = "separate";
    lVar2 = 8;
  }
  else if (config == 1) {
    pcVar3 = "contig";
    lVar2 = 6;
  }
  else {
    pcVar3 = "unrecognized";
    lVar2 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

void print_tif_info(
    uint32_t width, uint32_t height,
    uint16_t bps, uint16_t spp,
    uint16_t config,
    uint16_t type)
{
    std::cout << "  Resolution: " << width << "px x " <<  height << "px" << std::endl;
    std::cout << "  Type: ";

    switch (type) {
        case SAMPLEFORMAT_UINT:
            std::cout << "uint" << bps << std::endl;
            break;
        case SAMPLEFORMAT_INT:
            std::cout << "int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_IEEEFP:
            std::cout << "float" << bps << std::endl;
            break;
        case SAMPLEFORMAT_VOID:
            std::cout << "void" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXINT:
            std::cout << "complex int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXIEEEFP:
            std::cout << "complex float" << bps << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }

    std::cout << "  Planar config:";

    switch (config) {
        case PLANARCONFIG_CONTIG:
            std::cout << "contig" << std::endl;
            break;
        case PLANARCONFIG_SEPARATE:
            std::cout << "separate" << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }
}